

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pbVar1;
  bool bVar2;
  string *this_00;
  string output;
  string input;
  cmStringReplaceHelper replaceHelper;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  cmStringReplaceHelper local_188;
  
  this_00 = &local_228;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_1a8,(string *)(pbVar1 + 3));
  cmStringReplaceHelper::cmStringReplaceHelper
            (&local_188,pbVar1 + 2,&local_1a8,(this->super_cmCommand).Makefile);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (local_188.ValidReplaceExpression == false) {
    std::operator+(&local_228,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
    std::operator+(&local_208,&local_228,".");
    cmCommand::SetError(&this->super_cmCommand,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
  }
  else {
    cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
    if (local_188.RegularExpression.program != (char *)0x0) {
      local_1e8._M_string_length =
           (size_type)
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_1e8._M_dataplus._M_p =
           (pointer)((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 5);
      delimiter = &local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      local_228._M_dataplus._M_p = (pointer)delimiter;
      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                (&local_208,
                 (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&local_1e8,delimiter->_M_local_buf);
      std::__cxx11::string::~string((string *)&local_228);
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      local_228._M_dataplus._M_p = (pointer)delimiter;
      bVar2 = cmStringReplaceHelper::Replace(&local_188,&local_208,&local_228);
      if (bVar2) {
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,pbVar1 + 4,local_228._M_dataplus._M_p);
      }
      else {
        std::operator+(&local_1c8,"sub-command REGEX, mode REPLACE: ",&local_188.ErrorString);
        std::operator+(&local_1e8,&local_1c8,".");
        cmCommand::SetError(&this->super_cmCommand,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      goto LAB_002891d6;
    }
    std::operator+(&local_228,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                   pbVar1 + 2);
    std::operator+(&local_208,&local_228,"\".");
    std::__cxx11::string::~string((string *)&local_228);
    cmCommand::SetError(&this->super_cmCommand,&local_208);
    this_00 = &local_208;
  }
  std::__cxx11::string::~string((string *)this_00);
  bVar2 = false;
LAB_002891d6:
  cmStringReplaceHelper::~cmStringReplaceHelper(&local_188);
  return bVar2;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string const& regex = args[2];
  std::string const& replace = args[3];
  std::string const& outvar = args[4];
  cmStringReplaceHelper replaceHelper(regex, replace, this->Makefile);

  if (!replaceHelper.IsReplaceExpressionValid()) {
    this->SetError(
      "sub-command REGEX, mode REPLACE: " + replaceHelper.GetError() + ".");
    return false;
  }

  this->Makefile->ClearMatches();

  if (!replaceHelper.IsRegularExpressionValid()) {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  const std::string input =
    cmJoin(cmMakeRange(args).advance(5), std::string());
  std::string output;

  if (!replaceHelper.Replace(input, output)) {
    this->SetError(
      "sub-command REGEX, mode REPLACE: " + replaceHelper.GetError() + ".");
    return false;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}